

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

int MMDB_read_node(MMDB_s *mmdb,uint32_t node_number,MMDB_search_node_s *node)

{
  uint8_t *puVar1;
  uint64_t record;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  record_info_s record_info;
  
  record_info_for_database(&record_info,mmdb);
  if ((ulong)record_info.right_record_offset == 0) {
    iVar5 = 6;
  }
  else if ((mmdb->metadata).node_count < node_number) {
    iVar5 = 10;
  }
  else {
    puVar1 = mmdb->file_content;
    uVar3 = (*record_info.left_record_getter)(puVar1 + record_info.record_length * node_number);
    node->left_record = (ulong)uVar3;
    uVar4 = (*record_info.right_record_getter)
                      (puVar1 + record_info.record_length * node_number +
                       record_info.right_record_offset);
    node->right_record = (ulong)uVar4;
    record = node->left_record;
    uVar2 = record_type(mmdb,record);
    node->left_record_type = uVar2;
    uVar2 = record_type(mmdb,(ulong)uVar4);
    node->right_record_type = uVar2;
    uVar3 = (mmdb->metadata).node_count;
    (node->left_record_entry).mmdb = mmdb;
    (node->left_record_entry).offset = ((int)record - uVar3) - 0x10;
    uVar3 = (mmdb->metadata).node_count;
    (node->right_record_entry).mmdb = mmdb;
    (node->right_record_entry).offset = (uVar4 - uVar3) - 0x10;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int MMDB_read_node(const MMDB_s *const mmdb,
                   uint32_t node_number,
                   MMDB_search_node_s *const node) {
    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    if (node_number > mmdb->metadata.node_count) {
        return MMDB_INVALID_NODE_NUMBER_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    const uint8_t *record_pointer =
        &search_tree[node_number * record_info.record_length];
    node->left_record = record_info.left_record_getter(record_pointer);
    record_pointer += record_info.right_record_offset;
    node->right_record = record_info.right_record_getter(record_pointer);

    node->left_record_type = record_type(mmdb, node->left_record);
    node->right_record_type = record_type(mmdb, node->right_record);

    // Note that offset will be invalid if the record type is not
    // MMDB_RECORD_TYPE_DATA, but that's ok. Any use of the record entry
    // for other data types is a programming error.
    node->left_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->left_record),
    };
    node->right_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->right_record),
    };

    return MMDB_SUCCESS;
}